

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PigLatinTranslator::separate_punctuation
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PigLatinTranslator *this,string *text)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  reference pvVar4;
  long lVar5;
  long lVar6;
  bool local_e9;
  bool local_c9;
  string local_a8 [32];
  string local_88 [36];
  int local_64;
  string local_60 [4];
  int word_end;
  int local_3c;
  int word_start;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_22;
  undefined1 local_21;
  string *local_20;
  string *text_local;
  PigLatinTranslator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *punct_sep_str;
  
  local_21 = 0;
  local_20 = text;
  text_local = (string *)this;
  this_local = (PigLatinTranslator *)__return_storage_ptr__;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_22);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,3,&local_22);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_22);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_3c = 0;
    while( true ) {
      uVar1 = (ulong)local_3c;
      uVar2 = std::__cxx11::string::size();
      local_c9 = false;
      if (uVar1 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
        local_c9 = is_punctuation(this,*pcVar3);
      }
      if (local_c9 == false) break;
      local_3c = local_3c + 1;
    }
    if (0 < local_3c) {
      std::__cxx11::string::substr((ulong)local_60,(ulong)local_20);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      std::__cxx11::string::operator=((string *)pvVar4,local_60);
      std::__cxx11::string::~string(local_60);
    }
    lVar5 = (long)local_3c;
    lVar6 = std::__cxx11::string::size();
    if (lVar5 != lVar6) {
      local_64 = std::__cxx11::string::size();
      do {
        local_64 = local_64 + -1;
        local_e9 = false;
        if (0 < local_64) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
          local_e9 = is_punctuation(this,*pcVar3);
        }
      } while (local_e9 != false);
      uVar1 = (ulong)local_64;
      uVar2 = std::__cxx11::string::size();
      if (uVar1 < uVar2) {
        std::__cxx11::string::substr((ulong)local_88,(ulong)local_20);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](__return_storage_ptr__,2);
        std::__cxx11::string::operator=((string *)pvVar4,local_88);
        std::__cxx11::string::~string(local_88);
      }
      std::__cxx11::string::substr((ulong)local_a8,(ulong)local_20);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](__return_storage_ptr__,1);
      std::__cxx11::string::operator=((string *)pvVar4,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PigLatinTranslator::separate_punctuation(const std::string& text) const {
    std::vector<std::string> punct_sep_str(3);

    if( text.empty() ) {
        return punct_sep_str;
    }

    // Find beginning of the word
    int word_start = 0;
    while (word_start < text.size() && is_punctuation(text[word_start])) {
        word_start++;
    }

    // Store start punctuation
    if (word_start > 0) {
        punct_sep_str[0] = text.substr(0, word_start);
    }
    if (word_start == text.size()) {
        // Only punctuation
        return punct_sep_str;
    }

    // Find end of word
    int word_end = text.size() - 1;
    while (word_end > 0 && is_punctuation(text[word_end])) {
        word_end--;
    }

    // Store end punctuation
    if (word_end < text.size()) {
        punct_sep_str[2] = text.substr(word_end+1);
    }

    // Store word and return
    punct_sep_str[1] = text.substr(word_start, word_end - word_start + 1);
    return punct_sep_str;
}